

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store.c
# Opt level: O2

void borg_init_store(void)

{
  char *fmt;
  borg_item_conflict *pbVar1;
  uint uVar2;
  wchar_t i;
  ulong uVar3;
  
  uVar2 = f_info[0xe].shopnum - 1;
  if (uVar2 != 7) {
    fmt = format("borg thinks home is %d, game thinks home is %d.  aborting. ",(ulong)uVar2,7);
    msg(fmt);
    borg_init_failure = true;
  }
  borg_shops = (borg_shop *)mem_zalloc((ulong)z_info->store_max << 3);
  borg_safe_shops = (borg_shop *)mem_zalloc((ulong)z_info->store_max << 3);
  for (uVar3 = 0; uVar3 < z_info->store_max; uVar3 = uVar3 + 1) {
    pbVar1 = (borg_item_conflict *)mem_zalloc((ulong)z_info->store_inven_max * 0x388);
    borg_shops[uVar3].ware = pbVar1;
    pbVar1 = (borg_item_conflict *)mem_zalloc((ulong)z_info->store_inven_max * 0x388);
    borg_safe_shops[uVar3].ware = pbVar1;
  }
  borg_init_store_sell();
  return;
}

Assistant:

void borg_init_store(void)
{
    if (f_info[FEAT_HOME].shopnum - 1 != BORG_HOME) {
        msg(format("borg thinks home is %d, game thinks home is %d.  aborting. ", 
            f_info[FEAT_HOME].shopnum - 1, BORG_HOME));
        borg_init_failure = true;
    }


    /* Make the stores in the town */
    borg_shops = mem_zalloc(z_info->store_max * sizeof(borg_shop));

    /* Make the "safe" stores in the town */
    borg_safe_shops = mem_zalloc(z_info->store_max * sizeof(borg_shop));

    for (int i = 0; i < z_info->store_max; i++) {
        borg_shops[i].ware = mem_zalloc(z_info->store_inven_max * sizeof(borg_item));
        borg_safe_shops[i].ware = mem_zalloc(z_info->store_inven_max * sizeof(borg_item));
    }

    borg_init_store_sell();
}